

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

bool __thiscall
cmMakefile::ExecuteCommand
          (cmMakefile *this,cmListFileFunction *lff,cmExecutionStatus *status,
          optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *deferId)

{
  bool bVar1;
  size_t sVar2;
  ostream *poVar3;
  cmake *pcVar4;
  byte bVar5;
  char local_209;
  string error;
  cmMakefileCall stack_manager;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1d0;
  ostringstream e;
  _Manager_type local_198;
  
  bVar1 = IsFunctionBlocked(this,lff,status);
  bVar5 = 1;
  if (!bVar1) {
    if ((this->ExecuteCommandCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
      std::function<void_()>::operator()(&this->ExecuteCommandCallback);
    }
    std::
    _Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    ::_Optional_base((_Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      *)&local_1d0,
                     &deferId->
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    );
    cmMakefileCall::cmMakefileCall
              (&stack_manager,this,lff,
               (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)&local_1d0,status);
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset(&local_1d0);
    sVar2 = GetRecursionDepthLimit(this);
    if (sVar2 < this->RecursionDepth) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
      poVar3 = std::operator<<((ostream *)&e,"Maximum recursion depth of ");
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
      std::operator<<(poVar3," exceeded");
      std::__cxx11::stringbuf::str();
      IssueMessage(this,FATAL_ERROR,&error);
      std::__cxx11::string::~string((string *)&error);
      cmSystemTools::s_FatalErrorOccurred = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
      bVar5 = 0;
    }
    else {
      cmState::GetCommandByExactName
                ((Command *)&e,
                 (this->GlobalGenerator->CMakeInstance->State)._M_t.
                 super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                 super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                 super__Head_base<0UL,_cmState_*,_false>._M_head_impl,
                 &((lff->Impl).
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->LowerCaseName);
      if (local_198 == (_Manager_type)0x0) {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        bVar5 = 1;
        if (!bVar1) {
          cmStrCat<char_const(&)[24],std::__cxx11::string_const&,char_const(&)[3]>
                    (&error,(char (*) [24])"Unknown CMake command \"",
                     &((lff->Impl).
                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->OriginalName,(char (*) [3])0x723d14);
          IssueMessage(this,FATAL_ERROR,&error);
          cmSystemTools::s_FatalErrorOccurred = true;
          std::__cxx11::string::~string((string *)&error);
          bVar5 = 0;
        }
      }
      else {
        bVar1 = cmSystemTools::GetFatalErrorOccurred();
        bVar5 = 1;
        if (!bVar1) {
          if (this->GlobalGenerator->CMakeInstance->Trace == true) {
            PrintCommandTrace(this,lff,&this->Backtrace,No);
          }
          bVar1 = std::
                  function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                  ::operator()((function<bool_(const_std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>_&,_cmExecutionStatus_&)>
                                *)&e,&((lff->Impl).
                                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->Arguments,status);
          bVar5 = !bVar1 | status->NestedError;
          if (bVar5 == 0) {
            pcVar4 = this->GlobalGenerator->CMakeInstance;
          }
          else {
            if (status->NestedError == false) {
              local_209 = ' ';
              cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                        (&error,&((lff->Impl).
                                  super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->OriginalName,&local_209,&status->Error);
              IssueMessage(this,FATAL_ERROR,&error);
              std::__cxx11::string::~string((string *)&error);
            }
            pcVar4 = this->GlobalGenerator->CMakeInstance;
            if (pcVar4->CurrentWorkingMode != NORMAL_MODE) {
              cmSystemTools::s_FatalErrorOccurred = true;
            }
          }
          bVar5 = bVar5 ^ 1;
          if (((pcVar4->ScriptModeExitCode).super__Optional_base<int,_true,_true>._M_payload.
               super__Optional_payload_base<int>._M_engaged == true) &&
             (pcVar4->CurrentWorkingMode == SCRIPT_MODE)) {
            (status->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> =
                 (_Optional_payload_base<int>)
                 ((ulong)(uint)(pcVar4->ScriptModeExitCode).super__Optional_base<int,_true,_true>.
                               _M_payload.super__Optional_payload_base<int>._M_payload._M_value |
                 0x100000000);
          }
        }
      }
      std::_Function_base::~_Function_base((_Function_base *)&e);
    }
    cmMakefileCall::~cmMakefileCall(&stack_manager);
  }
  return (bool)bVar5;
}

Assistant:

bool cmMakefile::ExecuteCommand(const cmListFileFunction& lff,
                                cmExecutionStatus& status,
                                cm::optional<std::string> deferId)
{
  bool result = true;

  // quick return if blocked
  if (this->IsFunctionBlocked(lff, status)) {
    // No error.
    return result;
  }

  if (this->ExecuteCommandCallback) {
    this->ExecuteCommandCallback();
  }

  // Place this call on the call stack.
  cmMakefileCall stack_manager(this, lff, std::move(deferId), status);
  static_cast<void>(stack_manager);

  // Check for maximum recursion depth.
  size_t depthLimit = this->GetRecursionDepthLimit();
  if (this->RecursionDepth > depthLimit) {
    std::ostringstream e;
    e << "Maximum recursion depth of " << depthLimit << " exceeded";
    this->IssueMessage(MessageType::FATAL_ERROR, e.str());
    cmSystemTools::SetFatalErrorOccurred();
    return false;
  }

  // Lookup the command prototype.
  if (cmState::Command command =
        this->GetState()->GetCommandByExactName(lff.LowerCaseName())) {
    // Decide whether to invoke the command.
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      // if trace is enabled, print out invoke information
      if (this->GetCMakeInstance()->GetTrace()) {
        this->PrintCommandTrace(lff, this->Backtrace);
      }
      // Try invoking the command.
      bool invokeSucceeded = command(lff.Arguments(), status);
      bool hadNestedError = status.GetNestedError();
      if (!invokeSucceeded || hadNestedError) {
        if (!hadNestedError) {
          // The command invocation requested that we report an error.
          std::string const error =
            cmStrCat(lff.OriginalName(), ' ', status.GetError());
          this->IssueMessage(MessageType::FATAL_ERROR, error);
        }
        result = false;
        if (this->GetCMakeInstance()->GetWorkingMode() != cmake::NORMAL_MODE) {
          cmSystemTools::SetFatalErrorOccurred();
        }
      }
      if (this->GetCMakeInstance()->HasScriptModeExitCode() &&
          this->GetCMakeInstance()->GetWorkingMode() == cmake::SCRIPT_MODE) {
        // pass-through the exit code from inner cmake_language(EXIT) ,
        // possibly from include() or similar command...
        status.SetExitCode(this->GetCMakeInstance()->GetScriptModeExitCode());
      }
    }
  } else {
    if (!cmSystemTools::GetFatalErrorOccurred()) {
      std::string error =
        cmStrCat("Unknown CMake command \"", lff.OriginalName(), "\".");
      this->IssueMessage(MessageType::FATAL_ERROR, error);
      result = false;
      cmSystemTools::SetFatalErrorOccurred();
    }
  }

  return result;
}